

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int check_padding_md(EVP_MD *md,int padding)

{
  int padding_local;
  EVP_MD *md_local;
  
  if (md == (EVP_MD *)0x0) {
    md_local._4_4_ = 1;
  }
  else if (padding == 3) {
    ERR_put_error(6,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,0x151);
    md_local._4_4_ = 0;
  }
  else {
    md_local._4_4_ = 1;
  }
  return md_local._4_4_;
}

Assistant:

static int check_padding_md(const EVP_MD *md, int padding) {
  if (!md) {
    return 1;
  }

  if (padding == RSA_NO_PADDING) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
    return 0;
  }

  return 1;
}